

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O3

SecAttrOvr * getsecattrovr(GlobalVars *gv,char *name,uint32_t flags)

{
  SecAttrOvr *pSVar1;
  int iVar2;
  char *__s2;
  
  __s2 = "";
  if (name != (char *)0x0) {
    __s2 = name;
  }
  pSVar1 = gv->secattrovrs;
  while( true ) {
    if (pSVar1 == (SecAttrOvr *)0x0) {
      return (SecAttrOvr *)0x0;
    }
    iVar2 = strcmp(pSVar1->name,__s2);
    if ((iVar2 == 0) && ((pSVar1->flags & flags) != 0)) break;
    pSVar1 = pSVar1->next;
  }
  return pSVar1;
}

Assistant:

struct SecAttrOvr *getsecattrovr(struct GlobalVars *gv,const char *name,
                                 uint32_t flags)
/* Return a SecAttrOvr node which matches section name and flags. */
{
  struct SecAttrOvr *sao;

  if (name == NULL)
    name = noname;
  for (sao=gv->secattrovrs; sao!=NULL; sao=sao->next) {
    if (!strcmp(sao->name,name) && (sao->flags & flags)!=0)
      break;
  }
  return sao;
}